

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# haxx_algebra.cxx
# Opt level: O0

void __thiscall HAXX_ALGEBRA::conj::test_method(conj *this)

{
  bool bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  quaternion<double> p;
  quaternion<double> q;
  basic_cstring<const_char> *in_stack_fffffffffffffa90;
  char *in_stack_fffffffffffffa98;
  quaternion<double> *in_stack_fffffffffffffab0;
  undefined8 uVar8;
  basic_cstring<const_char> local_3b8;
  basic_cstring<const_char> local_3a8;
  undefined1 local_398 [40];
  undefined1 local_370 [16];
  basic_cstring<const_char> local_360;
  basic_cstring<const_char> local_350;
  basic_cstring<const_char> local_340;
  undefined1 local_330 [40];
  undefined1 local_308 [16];
  basic_cstring<const_char> local_2f8;
  basic_cstring<const_char> local_2e8;
  basic_cstring<const_char> local_2d8;
  undefined1 local_2c8 [40];
  undefined1 local_2a0 [16];
  basic_cstring<const_char> local_290;
  basic_cstring<const_char> local_280;
  basic_cstring<const_char> local_270;
  undefined1 local_260 [40];
  undefined1 local_238 [16];
  basic_cstring<const_char> local_228;
  basic_cstring<const_char> local_218;
  basic_cstring<const_char> local_208;
  undefined1 local_1f8 [40];
  undefined1 local_1d0 [16];
  basic_cstring<const_char> local_1c0;
  basic_cstring<const_char> local_1b0;
  basic_cstring<const_char> local_1a0;
  undefined1 local_190 [40];
  undefined1 local_168 [16];
  basic_cstring<const_char> local_158;
  basic_cstring<const_char> local_148;
  basic_cstring<const_char> local_138;
  undefined1 local_128 [40];
  undefined1 local_100 [16];
  basic_cstring<const_char> local_f0;
  basic_cstring<const_char> local_e0 [2];
  basic_cstring<const_char> local_c0;
  undefined1 local_b0 [40];
  undefined1 local_88 [16];
  basic_cstring<const_char> local_78;
  quaternion<double> local_68;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  quaternion<double> local_28;
  
  local_30 = 1.0;
  local_38 = 2.0;
  local_40 = 3.0;
  local_48 = 4.0;
  HAXX::quaternion<double>::quaternion(&local_28,&local_30,&local_38,&local_40,&local_48);
  HAXX::conj<double>(in_stack_fffffffffffffab0);
  do {
    uVar8 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_78,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_algebra.cxx"
               ,0x5e);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffffa90);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar8,&local_78,0x14,local_88);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffa98,(char (*) [1])in_stack_fffffffffffffa90);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_c0,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_algebra.cxx"
               ,0x5e);
    local_e0[0].m_end = (iterator)HAXX::quaternion<double>::real(&local_68);
    local_e0[0].m_begin = (iterator)HAXX::quaternion<double>::real(&local_28);
    in_stack_fffffffffffffa98 = "q.real()";
    in_stack_fffffffffffffa90 = local_e0;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,double,double>
              (local_b0,&local_c0,0x14,1,2,&local_e0[0].m_end,"p.real()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x18b52b);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    uVar8 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_f0,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_algebra.cxx"
               ,0x5e);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffffa90);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar8,&local_f0,0x15,local_100);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffa98,(char (*) [1])in_stack_fffffffffffffa90);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_138,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_algebra.cxx"
               ,0x5e);
    local_148.m_end = (iterator)HAXX::quaternion<double>::imag_i(&local_68);
    auVar2._0_8_ = HAXX::quaternion<double>::imag_i(&local_28);
    auVar2._8_8_ = 0;
    auVar5._8_8_ = 0x8000000000000000;
    auVar5._0_8_ = 0x8000000000000000;
    local_148.m_begin = (iterator)vmovlpd_avx(auVar2 ^ auVar5);
    in_stack_fffffffffffffa98 = "-q.imag_i()";
    in_stack_fffffffffffffa90 = &local_148;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,double,double>
              (local_128,&local_138,0x15,1,2,&local_148.m_end,"p.imag_i()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x18b6ad);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    uVar8 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_158,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_algebra.cxx"
               ,0x5e);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffffa90);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar8,&local_158,0x16,local_168);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffa98,(char (*) [1])in_stack_fffffffffffffa90);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_algebra.cxx"
               ,0x5e);
    local_1b0.m_end = (iterator)HAXX::quaternion<double>::imag_j(&local_68);
    auVar3._0_8_ = HAXX::quaternion<double>::imag_j(&local_28);
    auVar3._8_8_ = 0;
    auVar6._8_8_ = 0x8000000000000000;
    auVar6._0_8_ = 0x8000000000000000;
    local_1b0.m_begin = (iterator)vmovlpd_avx(auVar3 ^ auVar6);
    in_stack_fffffffffffffa98 = "-q.imag_j()";
    in_stack_fffffffffffffa90 = &local_1b0;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,double,double>
              (local_190,&local_1a0,0x16,1,2,&local_1b0.m_end,"p.imag_j()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x18b82f);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    uVar8 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_algebra.cxx"
               ,0x5e);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffffa90);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar8,&local_1c0,0x17,local_1d0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffa98,(char (*) [1])in_stack_fffffffffffffa90);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_208,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_algebra.cxx"
               ,0x5e);
    local_218.m_end = (iterator)HAXX::quaternion<double>::imag_k(&local_68);
    auVar4._0_8_ = HAXX::quaternion<double>::imag_k(&local_28);
    auVar4._8_8_ = 0;
    auVar7._8_8_ = 0x8000000000000000;
    auVar7._0_8_ = 0x8000000000000000;
    local_218.m_begin = (iterator)vmovlpd_avx(auVar4 ^ auVar7);
    in_stack_fffffffffffffa98 = "-q.imag_k()";
    in_stack_fffffffffffffa90 = &local_218;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,double,double>
              (local_1f8,&local_208,0x17,1,2,&local_218.m_end,"p.imag_k()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x18b9b1);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    uVar8 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_228,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_algebra.cxx"
               ,0x5e);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffffa90);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar8,&local_228,0x19,local_238);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffa98,(char (*) [1])in_stack_fffffffffffffa90);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_270,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_algebra.cxx"
               ,0x5e);
    local_280.m_end = (iterator)HAXX::quaternion<double>::real(&local_28);
    local_280.m_begin = (iterator)0x3ff0000000000000;
    in_stack_fffffffffffffa98 = "1.";
    in_stack_fffffffffffffa90 = &local_280;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,double,double>
              (local_260,&local_270,0x19,1,2,&local_280.m_end,"q.real()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x18bb0e);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    uVar8 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_290,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_algebra.cxx"
               ,0x5e);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffffa90);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar8,&local_290,0x1a,local_2a0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffa98,(char (*) [1])in_stack_fffffffffffffa90);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2d8,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_algebra.cxx"
               ,0x5e);
    local_2e8.m_end = (iterator)HAXX::quaternion<double>::imag_i(&local_28);
    local_2e8.m_begin = (iterator)0x4000000000000000;
    in_stack_fffffffffffffa98 = "2.";
    in_stack_fffffffffffffa90 = &local_2e8;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,double,double>
              (local_2c8,&local_2d8,0x1a,1,2,&local_2e8.m_end,"q.imag_i()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x18bc6b);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    uVar8 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2f8,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_algebra.cxx"
               ,0x5e);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffffa90);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar8,&local_2f8,0x1b,local_308);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffa98,(char (*) [1])in_stack_fffffffffffffa90);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_340,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_algebra.cxx"
               ,0x5e);
    local_350.m_end = (iterator)HAXX::quaternion<double>::imag_j(&local_28);
    local_350.m_begin = (iterator)0x4008000000000000;
    in_stack_fffffffffffffa98 = "3.";
    in_stack_fffffffffffffa90 = &local_350;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,double,double>
              (local_330,&local_340,0x1b,1,2,&local_350.m_end,"q.imag_j()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x18bda4);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    uVar8 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_360,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_algebra.cxx"
               ,0x5e);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffffa90);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar8,&local_360,0x1c,local_370);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffa98,(char (*) [1])in_stack_fffffffffffffa90);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3a8,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_algebra.cxx"
               ,0x5e);
    local_3b8.m_end = (iterator)HAXX::quaternion<double>::imag_k(&local_28);
    local_3b8.m_begin = (iterator)0x4010000000000000;
    in_stack_fffffffffffffa98 = "4.";
    in_stack_fffffffffffffa90 = &local_3b8;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,double,double>
              (local_398,&local_3a8,0x1c,1,2,&local_3b8.m_end,"q.imag_k()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x18bedd);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(conj)
{
  HAXX::quaternion<double> q(1.,2.,3.,4.);
  HAXX::quaternion<double> p = HAXX::conj(q);

  
  BOOST_CHECK_EQUAL(p.real(),  q.real()   );
  BOOST_CHECK_EQUAL(p.imag_i(),-q.imag_i());
  BOOST_CHECK_EQUAL(p.imag_j(),-q.imag_j());
  BOOST_CHECK_EQUAL(p.imag_k(),-q.imag_k());

  BOOST_CHECK_EQUAL(q.real(),  1.);
  BOOST_CHECK_EQUAL(q.imag_i(),2.);
  BOOST_CHECK_EQUAL(q.imag_j(),3.);
  BOOST_CHECK_EQUAL(q.imag_k(),4.);
}